

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

vector<Bipartition,_std::allocator<Bipartition>_> * __thiscall PhyloTree::getSplits(PhyloTree *this)

{
  bool bVar1;
  vector<Bipartition,_std::allocator<Bipartition>_> *in_RSI;
  PhyloTreeEdge *in_RDI;
  PhyloTreeEdge *edge;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  vector<Bipartition,_std::allocator<Bipartition>_> *splits;
  size_type in_stack_ffffffffffffffb8;
  vector<Bipartition,_std::allocator<Bipartition>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_38;
  pointer *local_30;
  undefined1 local_11;
  
  local_11 = 0;
  std::vector<Bipartition,_std::allocator<Bipartition>_>::vector
            ((vector<Bipartition,_std::allocator<Bipartition>_> *)0x16d0d4);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             &in_RSI[1].super__Vector_base<Bipartition,_std::allocator<Bipartition>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::vector<Bipartition,_std::allocator<Bipartition>_>::reserve
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_30 = &in_RSI[1].super__Vector_base<Bipartition,_std::allocator<Bipartition>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38._M_current =
       (PhyloTreeEdge *)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_RDI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)in_RSI,
                            (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*(&local_38);
    PhyloTreeEdge::asSplit(in_RDI);
    std::vector<Bipartition,_std::allocator<Bipartition>_>::push_back
              (in_RSI,&in_RDI->super_Bipartition);
    Bipartition::~Bipartition((Bipartition *)0x16d16d);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_38);
  }
  return (vector<Bipartition,_std::allocator<Bipartition>_> *)in_RDI;
}

Assistant:

vector<Bipartition> PhyloTree::getSplits() {
    vector<Bipartition> splits;
    splits.reserve(edges.size());
    for (auto &edge : edges) {
        splits.push_back(edge.asSplit());
    }

    return splits;
}